

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_SignWithPrivkeySimple_Test::
~ConfidentialTransactionContext_SignWithPrivkeySimple_Test
          (ConfidentialTransactionContext_SignWithPrivkeySimple_Test *this)

{
  void *in_RDI;
  
  ~ConfidentialTransactionContext_SignWithPrivkeySimple_Test
            ((ConfidentialTransactionContext_SignWithPrivkeySimple_Test *)0x1ec208);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, SignWithPrivkeySimple) {
  // P2shP2wpkh
  ConfidentialTransactionContext ctx("020000000101aca6c902e9569c99e172c22182f943e4ab15f28602ab248f65c864874a9ddc860000000000fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e0740000000000000000000000000000");

  EXPECT_NO_THROW(ctx.SignWithPrivkeySimple(
      OutPoint(Txid("86dc9d4a8764c8658f24ab0286f215abe443f98221c272e1999c56e902c9a6ac"), 0),
      Pubkey("02f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef"),
      Privkey::FromWif("cRar5dsNEddUTgXuuhsq5p2NRJUKiV58PUHEPgGe1k9CW8CGRzbj", NetType::kTestnet),
      SigHashType(), Amount::CreateBySatoshiAmount(3000002000),
      AddressType::kP2shP2wpkhAddress, true));
  EXPECT_STREQ(ctx.GetHex().c_str(), "020000000101aca6c902e9569c99e172c22182f943e4ab15f28602ab248f65c864874a9ddc8600000000171600141da984b5779f27a59dfb3499bce3823bf1824941fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e074000000000000000002473044022004fec212010170716d8a72a54b30451a67bdb7619cc1c7a59fa0aff3c01b37b202204652c79b5472bc55e6af682710b815b44fc7fdf6c4520edf6339e750ea4ecd99012102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef0000000000");
}